

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_Precision_Test::TestBody(FormatterTest_Precision_Test *this)

{
  bool bVar1;
  size_t sVar2;
  int *in_RCX;
  int *piVar3;
  uint *puVar4;
  long *plVar5;
  unsigned_long *puVar6;
  longlong *plVar7;
  unsigned_long_long *puVar8;
  char *args;
  double *args_00;
  longdouble *args_01;
  void **ppvVar9;
  char (*args_02) [4];
  char *pcVar10;
  undefined1 local_418 [16];
  AssertionResult gtest_ar;
  string gtest_expected_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char format_str [256];
  
  safe_sprintf<256ul>(&format_str,"{0:.%u",0xffffffffffffffff);
  increment(format_str + 4);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[256],int>(&local_138,(v5 *)format_str,(char (*) [256])local_418,in_RCX);
      std::__cxx11::string::~string((string *)&local_138);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x49b;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x49b,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  sVar2 = strlen(format_str);
  (format_str + sVar2)[0] = '}';
  (format_str + sVar2)[1] = '\0';
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[256],int>(&local_158,(v5 *)format_str,(char (*) [256])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_158);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x49f;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x49f,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  safe_sprintf<256ul>(&format_str,"{0:.%u",0x80000000);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[256],int>(&local_178,(v5 *)format_str,(char (*) [256])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_178);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4a2;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a2,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  safe_sprintf<256ul>(&format_str,"{0:.%u}",0x80000000);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[256],int>(&local_198,(v5 *)format_str,(char (*) [256])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_198);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4a4;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a4,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"missing precision specifier",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[5],int>(&local_1b8,(v5 *)"{0:.",(char (*) [5])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [99])
               "Expected: format(\"{0:.\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4a7;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a7,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"missing precision specifier",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[6],int>(&local_1d8,(v5 *)"{0:.}",(char (*) [6])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [100])
               "Expected: format(\"{0:.}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4a9;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4a9,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_10_ = (unkuint10)(uint6)local_418._4_6_ << 0x20;
      fmt::v5::format<char[6],int>(&local_1f8,(v5 *)"{0:.2",(char (*) [6])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [100])
               "Expected: format(\"{0:.2\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4ac;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ac,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_4_ = 0x2a;
      fmt::v5::format<char[7],int>(&local_218,(v5 *)"{0:.2}",(char (*) [7])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_218);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: format(\"{0:.2}\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4ae;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ae,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_4_ = 0x2a;
      fmt::v5::format<char[8],int>(&local_238,(v5 *)"{0:.2f}",(char (*) [8])local_418,piVar3);
      std::__cxx11::string::~string((string *)&local_238);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(\"{0:.2f}\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  puVar4 = (uint *)0x4b0;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b0,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_4_ = 0x2a;
      fmt::v5::format<char[7],unsigned_int>
                (&local_258,(v5 *)"{0:.2}",(char (*) [7])local_418,puVar4);
      std::__cxx11::string::~string((string *)&local_258);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(\"{0:.2}\", 42u) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  puVar4 = (uint *)0x4b2;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b2,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_4_ = 0x2a;
      fmt::v5::format<char[8],unsigned_int>
                (&local_278,(v5 *)"{0:.2f}",(char (*) [8])local_418,puVar4);
      std::__cxx11::string::~string((string *)&local_278);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:.2f}\", 42u) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  plVar5 = (long *)0x4b4;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b4,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[7],long>(&local_298,(v5 *)"{0:.2}",(char (*) [7])local_418,plVar5);
      std::__cxx11::string::~string((string *)&local_298);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(\"{0:.2}\", 42l) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  plVar5 = (long *)0x4b6;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b6,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[8],long>(&local_2b8,(v5 *)"{0:.2f}",(char (*) [8])local_418,plVar5);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:.2f}\", 42l) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  puVar6 = (unsigned_long *)0x4b8;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4b8,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[7],unsigned_long>
                (&local_2d8,(v5 *)"{0:.2}",(char (*) [7])local_418,puVar6);
      std::__cxx11::string::~string((string *)&local_2d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:.2}\", 42ul) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  puVar6 = (unsigned_long *)0x4ba;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ba,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[8],unsigned_long>
                (&local_2f8,(v5 *)"{0:.2f}",(char (*) [8])local_418,puVar6);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [105])
               "Expected: format(\"{0:.2f}\", 42ul) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  plVar7 = (longlong *)0x4bc;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4bc,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[7],long_long>(&local_318,(v5 *)"{0:.2}",(char (*) [7])local_418,plVar7);
      std::__cxx11::string::~string((string *)&local_318);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:.2}\", 42ll) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  plVar7 = (longlong *)0x4be;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4be,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[8],long_long>(&local_338,(v5 *)"{0:.2f}",(char (*) [8])local_418,plVar7);
      std::__cxx11::string::~string((string *)&local_338);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [105])
               "Expected: format(\"{0:.2f}\", 42ll) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  puVar8 = (unsigned_long_long *)0x4c0;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c0,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[7],unsigned_long_long>
                (&local_358,(v5 *)"{0:.2}",(char (*) [7])local_418,puVar8);
      std::__cxx11::string::~string((string *)&local_358);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [105])
               "Expected: format(\"{0:.2}\", 42ull) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  puVar8 = (unsigned_long_long *)0x4c2;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c2,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0x2a;
      fmt::v5::format<char[8],unsigned_long_long>
                (&local_378,(v5 *)"{0:.2f}",(char (*) [8])local_418,puVar8);
      std::__cxx11::string::~string((string *)&local_378);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [106])
               "Expected: format(\"{0:.2f}\", 42ull) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args = (char *)0x4c4;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c4,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418[0] = 0x78;
      fmt::v5::format<char[8],char>(&local_398,(v5 *)"{0:3.0}",(char (*) [8])local_418,args);
      std::__cxx11::string::~string((string *)&local_398);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:3.0}\", \'x\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_00 = (double *)0x4c6;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4c6,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_418._0_8_ = 0x3ff3c083126e978d;
  fmt::v5::format<char[7],double>
            (&gtest_expected_message,(v5 *)"{0:.2}",(char (*) [7])local_418,args_00);
  args_01 = (longdouble *)0x1f167d;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1.2\"","format(\"{0:.2}\", 1.2345)",(char (*) [4])0x1f167d,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_01 = (longdouble *)0x4c7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x4c7,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_418[0] = DAT_001e4070;
  local_418[1] = UNK_001e4071;
  local_418[2] = UNK_001e4072;
  local_418[3] = UNK_001e4073;
  local_418[4] = UNK_001e4074;
  local_418[5] = UNK_001e4075;
  local_418[6] = UNK_001e4076;
  local_418[7] = UNK_001e4077;
  local_418[8] = UNK_001e4078;
  local_418[9] = UNK_001e4079;
  fmt::v5::format<char[7],long_double>
            (&gtest_expected_message,(v5 *)"{0:.2}",(char (*) [7])local_418,args_01);
  ppvVar9 = (void **)0x1f167d;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1.2\"","format(\"{0:.2}\", 1.2345l)",(char (*) [4])0x1f167d,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    ppvVar9 = (void **)0x4c8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x4c8,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0xcafe;
      fmt::v5::format<char[7],void*>(&local_3b8,(v5 *)"{0:.2}",(char (*) [7])local_418,ppvVar9);
      std::__cxx11::string::~string((string *)&local_3b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [131])
               "Expected: format(\"{0:.2}\", reinterpret_cast<void*>(0xcafe)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  ppvVar9 = (void **)0x4cb;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4cb,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_418);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_418._0_8_ = 0xcafe;
      fmt::v5::format<char[8],void*>(&local_3d8,(v5 *)"{0:.2f}",(char (*) [8])local_418,ppvVar9);
      std::__cxx11::string::~string((string *)&local_3d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [132])
               "Expected: format(\"{0:.2f}\", reinterpret_cast<void*>(0xcafe)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar10 = "";
  }
  else {
    pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_02 = (char (*) [4])0x4cd;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4cd,pcVar10);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[7],char[4]>
            (&gtest_expected_message,(v5 *)"{0:.2}",(char (*) [7])"str",args_02);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"st\"","format(\"{0:.2}\", \"str\")",(char (*) [3])0x1e4792,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x4cf,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_418,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, Precision) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:.%u", UINT_MAX);
  increment(format_str + 4);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  safe_sprintf(format_str, "{0:.%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  safe_sprintf(format_str, "{0:.%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.", 0),
      format_error, "missing precision specifier");
  EXPECT_THROW_MSG(format("{0:.}", 0),
      format_error, "missing precision specifier");

  EXPECT_THROW_MSG(format("{0:.2", 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42u),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42u),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42l),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42l),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ul),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ul),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ll),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ll),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2}", 42ull),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", 42ull),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:3.0}", 'x'),
      format_error, "precision not allowed for this argument type");
  EXPECT_EQ("1.2", format("{0:.2}", 1.2345));
  EXPECT_EQ("1.2", format("{0:.2}", 1.2345l));

  EXPECT_THROW_MSG(format("{0:.2}", reinterpret_cast<void*>(0xcafe)),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.2f}", reinterpret_cast<void*>(0xcafe)),
      format_error, "precision not allowed for this argument type");

  EXPECT_EQ("st", format("{0:.2}", "str"));
}